

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_superblock.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_compressSuperBlock
                 (ZSTD_CCtx *zc,void *dst,size_t dstCapacity,void *src,size_t srcSize,uint lastBlock
                 )

{
  ushort uVar1;
  uint uVar2;
  seqDef *psVar3;
  uint *count;
  undefined8 uVar4;
  void *pvVar5;
  undefined2 *puVar6;
  ZSTD_compressedBlockState_t *pZVar7;
  U32 UVar8;
  int iVar9;
  int iVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  ulong uVar15;
  ulong uVar16;
  U32 UVar17;
  U32 UVar18;
  seqDef *psVar19;
  size_t matchLengthSum;
  ulong uVar20;
  long lVar21;
  uint uVar22;
  ulong uVar23;
  U32 UVar24;
  U32 UVar25;
  seqDef *psVar26;
  void *__src;
  undefined4 in_register_0000008c;
  size_t err_code_2;
  size_t __n;
  int litEntropyWritten;
  U32 UStack_244;
  U32 local_240;
  int seqEntropyWritten;
  size_t local_238;
  ulong local_230;
  void *local_228;
  long local_220;
  undefined2 *local_218;
  ZSTD_compressedBlockState_t *local_210;
  void *local_208;
  ulong local_200;
  seqDef *local_1f8;
  BYTE *local_1f0;
  BYTE *local_1e8;
  BYTE *local_1e0;
  ulong local_1d8;
  seqDef *local_1d0;
  size_t local_1c8;
  size_t local_1c0;
  ZSTD_CCtx *local_1b8;
  size_t local_1b0;
  seqDef *local_1a8;
  ZSTD_compressedBlockState_t *local_1a0;
  seqDef *local_198;
  undefined8 local_190;
  ulong local_188;
  ZSTD_CCtx_params *local_180;
  long local_178;
  ulong local_170;
  ZSTD_entropyCTablesMetadata_t entropyMetadata;
  
  local_190 = CONCAT44(in_register_0000008c,lastBlock);
  local_180 = &zc->appliedParams;
  local_228 = src;
  sVar11 = ZSTD_buildBlockEntropyStats
                     (&zc->seqStore,&((zc->blockState).prevCBlock)->entropy,
                      &((zc->blockState).nextCBlock)->entropy,local_180,&entropyMetadata,
                      zc->entropyWorkspace,0x22d8);
  if (0xffffffffffffff88 < sVar11) {
    return sVar11;
  }
  psVar19 = (zc->seqStore).sequencesStart;
  local_1f8 = (zc->seqStore).sequences;
  sVar11 = (long)local_1f8 - (long)psVar19 >> 3;
  psVar26 = (seqDef *)(zc->seqStore).litStart;
  psVar3 = (seqDef *)(zc->seqStore).lit;
  local_238 = (long)psVar3 - (long)psVar26;
  local_220 = dstCapacity + (long)dst;
  uVar23 = (zc->appliedParams).targetCBlockSize;
  uVar15 = 0x53c;
  if (0x53c < uVar23) {
    uVar15 = uVar23;
  }
  local_200 = (ulong)(entropyMetadata.hufMetadata.hType == set_compressed);
  local_1a0 = (zc->blockState).prevCBlock;
  local_210 = (zc->blockState).nextCBlock;
  local_188 = (ulong)(uint)zc->bmi2;
  local_1e0 = (zc->seqStore).llCode;
  local_1e8 = (zc->seqStore).mlCode;
  local_1f0 = (zc->seqStore).ofCode;
  local_230 = 1;
  local_218 = (undefined2 *)dst;
  local_1d0 = psVar19;
  local_1c8 = srcSize;
  if (local_1f8 == psVar19) {
    local_208 = local_228;
  }
  else {
    count = zc->entropyWorkspace;
    _litEntropyWritten = CONCAT44(UStack_244,0xff);
    local_1b0 = local_238;
    local_1d8 = uVar15;
    local_1a8 = psVar26;
    local_198 = psVar3;
    if (entropyMetadata.hufMetadata.hType - set_compressed < 2) {
      sVar12 = HIST_count_wksp(count,(uint *)&litEntropyWritten,psVar26,local_238,count,0x22d8);
      if (sVar12 < 0xffffffffffffff89) {
        sVar12 = HUF_estimateCompressedSize((HUF_CElt *)local_210,count,litEntropyWritten);
        if (entropyMetadata.hufMetadata.hType != set_compressed) {
          entropyMetadata.hufMetadata.hufDesSize = 0;
        }
        local_1b0 = sVar12 + entropyMetadata.hufMetadata.hufDesSize + 3;
      }
    }
    else if (entropyMetadata.hufMetadata.hType != set_basic) {
      if (entropyMetadata.hufMetadata.hType == set_rle) {
        local_1b0 = 1;
      }
      else {
        local_1b0 = 0;
      }
    }
    pZVar7 = local_210;
    sVar12 = ZSTD_estimateSubBlockSize_symbolType
                       (entropyMetadata.fseMetadata.ofType,local_1f0,0x1f,sVar11,
                        (local_210->entropy).fse.offcodeCTable,(U8 *)0x0,(short *)OF_defaultNorm,5,
                        0x1c,count,_litEntropyWritten);
    sVar13 = ZSTD_estimateSubBlockSize_symbolType
                       (entropyMetadata.fseMetadata.llType,local_1e0,0x23,sVar11,
                        (pZVar7->entropy).fse.litlengthCTable,LL_bits,(short *)LL_defaultNorm,6,0x23
                        ,count,_litEntropyWritten);
    sVar14 = ZSTD_estimateSubBlockSize_symbolType
                       (entropyMetadata.fseMetadata.mlType,local_1e8,0x34,sVar11,
                        (pZVar7->entropy).fse.matchlengthCTable,ML_bits,(short *)ML_defaultNorm,6,
                        0x34,count,_litEntropyWritten);
    uVar23 = entropyMetadata.fseMetadata.fseTablesSize + sVar14 + sVar13 + sVar12 + local_1b0 + 6;
    if (local_198 == local_1a8) {
      uVar15 = 0x100;
    }
    else {
      uVar15 = (local_1b0 << 8) / local_238;
    }
    uVar16 = ((uVar23 - local_1b0) * 0x100) / sVar11;
    local_1d8 = ((local_1d8 >> 1) + uVar23) / local_1d8;
    uVar20 = local_1d8 + (local_1d8 == 0);
    local_1d8 = (uVar23 * 0x100) / uVar20;
    if (local_1c8 < uVar23) {
      return 0;
    }
    lVar21 = uVar20 - 1;
    psVar19 = local_1d0;
    psVar26 = local_1a8;
    dst = local_218;
    if (lVar21 == 0) {
      local_208 = local_228;
    }
    else {
      local_230 = 1;
      local_1b0 = uVar16 + 0x7800;
      local_208 = local_228;
      local_238 = 0;
      local_1c0 = uVar16;
      local_1b8 = zc;
      local_178 = lVar21;
      local_170 = uVar15;
      do {
        sVar11 = (long)local_1f8 - (long)psVar19 >> 3;
        sVar12 = local_1c0;
        if (local_238 == 0) {
          sVar12 = local_1b0;
        }
        sVar14 = 1;
        sVar13 = sVar14;
        if (1 < sVar11) {
          uVar23 = sVar12 + local_170 * psVar19->litLength;
          if (uVar23 <= local_1d8) {
            lVar21 = (ulong)psVar19->litLength + (ulong)psVar19->mlBase + 3;
            do {
              uVar23 = uVar23 + local_1c0 + local_170 * psVar19[sVar14].litLength;
              lVar21 = lVar21 + (ulong)psVar19[sVar14].litLength + (ulong)psVar19[sVar14].mlBase + 3
              ;
              if ((local_1d8 < uVar23) && (sVar13 = sVar14, uVar23 < (ulong)(lVar21 * 0x100)))
              break;
              sVar14 = sVar14 + 1;
              sVar13 = sVar11;
            } while (sVar11 != sVar14);
          }
        }
        if (psVar19 + sVar13 == local_1f8) goto LAB_01d68db7;
        _litEntropyWritten = _litEntropyWritten & 0xffffffff00000000;
        seqEntropyWritten = 0;
        uVar15 = (long)psVar19 - (long)(local_1b8->seqStore).sequencesStart;
        UVar24 = (local_1b8->seqStore).longLengthPos;
        sVar11 = 0;
        sVar12 = 0;
        uVar23 = uVar15;
        do {
          uVar1 = psVar19[sVar11].litLength;
          uVar22 = (uint)uVar1;
          if (UVar24 == (U32)(uVar23 >> 3)) {
            uVar22 = uVar1 + 0x10000;
            if ((local_1b8->seqStore).longLengthType != ZSTD_llt_literalLength) {
              uVar22 = (uint)uVar1;
            }
          }
          sVar12 = sVar12 + uVar22;
          sVar11 = sVar11 + 1;
          uVar23 = uVar23 + 8;
        } while (sVar13 != sVar11);
        lVar21 = 0;
        sVar11 = 0;
        do {
          uVar22 = psVar19[sVar11].mlBase + 3;
          if ((UVar24 == (U32)(uVar15 >> 3)) &&
             ((local_1b8->seqStore).longLengthType == ZSTD_llt_matchLength)) {
            uVar22 = psVar19[sVar11].mlBase + 0x10003;
          }
          lVar21 = lVar21 + (ulong)uVar22;
          sVar11 = sVar11 + 1;
          uVar15 = uVar15 + 8;
        } while (sVar13 != sVar11);
        local_1a8 = psVar19 + sVar13;
        sVar11 = ZSTD_compressSubBlock
                           (&local_210->entropy,&entropyMetadata,psVar19,sVar13,(BYTE *)psVar26,
                            sVar12,local_1e0,local_1e8,local_1f0,local_180,dst,local_220 - (long)dst
                            ,(int)local_188,(int)local_200,(int)local_230,&litEntropyWritten,
                            &seqEntropyWritten,0);
        if (0xffffffffffffff88 < sVar11) {
          return sVar11;
        }
        if ((sVar11 != 0) && (sVar11 < lVar21 + sVar12)) {
          local_208 = (void *)((long)local_208 + lVar21 + sVar12);
          psVar26 = (seqDef *)((long)&psVar26->offBase + sVar12);
          dst = (void *)((long)dst + sVar11);
          local_1e0 = local_1e0 + sVar13;
          local_1e8 = local_1e8 + sVar13;
          local_1f0 = local_1f0 + sVar13;
          local_200 = local_200 & 0xffffffff;
          if (litEntropyWritten != 0) {
            local_200 = 0;
          }
          local_230 = local_230 & 0xffffffff;
          psVar19 = local_1a8;
          if (seqEntropyWritten != 0) {
            local_230 = 0;
          }
        }
        local_238 = local_238 + 1;
      } while (local_238 != local_178);
      sVar11 = (long)local_1f8 - (long)psVar19 >> 3;
LAB_01d68db7:
      zc = local_1b8;
      local_238 = (long)local_198 - (long)psVar26;
    }
  }
  lVar21 = 0;
  _litEntropyWritten = _litEntropyWritten & 0xffffffff00000000;
  seqEntropyWritten = 0;
  if (local_1f8 != psVar19) {
    uVar23 = (long)psVar19 - (long)(zc->seqStore).sequencesStart;
    lVar21 = 0;
    sVar12 = 0;
    do {
      uVar22 = psVar19[sVar12].mlBase + 3;
      if (((zc->seqStore).longLengthPos == (U32)(uVar23 >> 3)) &&
         ((zc->seqStore).longLengthType == ZSTD_llt_matchLength)) {
        uVar22 = psVar19[sVar12].mlBase + 0x10003;
      }
      lVar21 = lVar21 + (ulong)uVar22;
      sVar12 = sVar12 + 1;
      uVar23 = uVar23 + 8;
    } while (sVar11 != sVar12);
  }
  sVar12 = ZSTD_compressSubBlock
                     (&local_210->entropy,&entropyMetadata,psVar19,sVar11,(BYTE *)psVar26,local_238,
                      local_1e0,local_1e8,local_1f0,local_180,dst,local_220 - (long)dst,
                      (int)local_188,(int)local_200,(int)local_230,&litEntropyWritten,
                      &seqEntropyWritten,(U32)local_190);
  pvVar5 = local_228;
  if (0xffffffffffffff88 < sVar12) {
    return sVar12;
  }
  iVar9 = (int)local_230;
  __src = local_208;
  iVar10 = iVar9;
  if ((sVar12 != 0) && (sVar12 < lVar21 + local_238)) {
    __src = (void *)((long)local_208 + lVar21 + local_238);
    dst = (void *)((long)dst + sVar12);
    iVar10 = 0;
    if (seqEntropyWritten == 0) {
      iVar10 = iVar9;
    }
    psVar19 = psVar19 + sVar11;
    if (litEntropyWritten != 0) goto LAB_01d68f67;
  }
  if ((int)local_200 != 0) {
    switchD_015de399::default(local_210,local_1a0,0x810);
  }
LAB_01d68f67:
  puVar6 = local_218;
  if ((iVar10 != 0) &&
     (((entropyMetadata.fseMetadata.llType - set_rle < 2 ||
       (entropyMetadata.fseMetadata.mlType - set_rle < 2)) ||
      (0xfffffffd < entropyMetadata.fseMetadata.ofType - set_repeat)))) {
    return 0;
  }
  if (__src < (void *)((long)pvVar5 + local_1c8)) {
    __n = (long)((long)pvVar5 + local_1c8) - (long)__src;
    uVar23 = __n + 3;
    if ((ulong)(local_220 - (long)dst) < uVar23) {
      return 0xffffffffffffffba;
    }
    iVar10 = (int)local_190 + (int)__n * 8;
    *(short *)dst = (short)iVar10;
    *(char *)((long)dst + 2) = (char)((uint)iVar10 >> 0x10);
    switchD_015de399::default((void *)((long)dst + 3),__src,__n);
    if (0xffffffffffffff88 < uVar23) {
      return uVar23;
    }
    dst = (void *)((long)dst + uVar23);
    if (psVar19 < local_1f8) {
      UVar24 = local_1a0->rep[2];
      local_240 = UVar24;
      _litEntropyWritten = *(ulong *)local_1a0->rep;
      uVar4 = _litEntropyWritten;
      if (local_1d0 < psVar19) {
        UStack_244 = (U32)(_litEntropyWritten >> 0x20);
        uVar23 = (long)local_1d0 - (long)(zc->seqStore).sequencesStart;
        UVar17 = litEntropyWritten;
        UVar18 = UStack_244;
        _litEntropyWritten = uVar4;
        do {
          uVar1 = local_1d0->litLength;
          uVar22 = (uint)uVar1;
          if (((zc->seqStore).longLengthPos == (U32)(uVar23 >> 3)) &&
             (uVar22 = uVar1 + 0x10000, (zc->seqStore).longLengthType != ZSTD_llt_literalLength)) {
            uVar22 = (uint)uVar1;
          }
          uVar2 = local_1d0->offBase;
          if (uVar2 < 4) {
            uVar22 = (uVar2 + (uVar22 == 0)) - 1;
            UVar25 = UVar17;
            UVar8 = UVar18;
            if (uVar22 != 0) {
              if (uVar22 == 3) {
                UVar25 = UVar17 - 1;
              }
              else {
                UVar25 = (&litEntropyWritten)[uVar22];
              }
              if (uVar22 == 1) {
                UVar18 = UVar24;
              }
              local_240 = UVar18;
              goto LAB_01d690c7;
            }
          }
          else {
            local_240 = UVar18;
            UVar25 = uVar2 - 3;
LAB_01d690c7:
            _litEntropyWritten = CONCAT44(UVar17,UVar25);
            UVar8 = UVar17;
            UVar24 = UVar18;
            local_240 = UVar18;
          }
          UVar18 = UVar8;
          UVar17 = UVar25;
          local_1d0 = local_1d0 + 1;
          uVar23 = uVar23 + 8;
        } while (local_1d0 < psVar19);
      }
      local_210->rep[2] = local_240;
      *(ulong *)local_210->rep = _litEntropyWritten;
    }
  }
  return (long)dst - (long)puVar6;
}

Assistant:

size_t ZSTD_compressSuperBlock(ZSTD_CCtx* zc,
                               void* dst, size_t dstCapacity,
                               const void* src, size_t srcSize,
                               unsigned lastBlock)
{
    ZSTD_entropyCTablesMetadata_t entropyMetadata;

    FORWARD_IF_ERROR(ZSTD_buildBlockEntropyStats(&zc->seqStore,
          &zc->blockState.prevCBlock->entropy,
          &zc->blockState.nextCBlock->entropy,
          &zc->appliedParams,
          &entropyMetadata,
          zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */), "");

    return ZSTD_compressSubBlock_multi(&zc->seqStore,
            zc->blockState.prevCBlock,
            zc->blockState.nextCBlock,
            &entropyMetadata,
            &zc->appliedParams,
            dst, dstCapacity,
            src, srcSize,
            zc->bmi2, lastBlock,
            zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */);
}